

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::retrieveNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  pMVar1 = this->head_;
  while( true ) {
    if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (pMVar1->memory_ == memory) break;
    pMVar1 = pMVar1->next_;
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::retrieveNode(char* memory)
{
  MemoryLeakDetectorNode* cur = head_;
  while (cur) {
    if (cur->memory_ == memory)
      return cur;
    cur = cur->next_;
  }
  return NULLPTR;
}